

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_AES.cpp
# Opt level: O2

AESEncContext * __thiscall ASDCP::AESEncContext::InitKey(AESEncContext *this,byte_t *key)

{
  long lVar1;
  undefined8 uVar2;
  SymmetricKey *pSVar3;
  int iVar4;
  ILogSink *this_00;
  h__AESContext *p;
  undefined8 *in_RDX;
  undefined1 *puVar5;
  
  if (in_RDX == (undefined8 *)0x0) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (this_00,"NULL pointer in file %s, line %d\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_AES.cpp"
               ,0x4a);
    puVar5 = Kumu::RESULT_PTR;
  }
  else if (*(long *)key == 0) {
    p = (h__AESContext *)operator_new(0x128);
    (p->m_KeyBuf).super_Identifier<16U>.m_HasValue = false;
    (p->m_KeyBuf).super_Identifier<16U>.m_Value[0] = '\0';
    (p->m_KeyBuf).super_Identifier<16U>.m_Value[1] = '\0';
    (p->m_KeyBuf).super_Identifier<16U>.m_Value[2] = '\0';
    (p->m_KeyBuf).super_Identifier<16U>.m_Value[3] = '\0';
    (p->m_KeyBuf).super_Identifier<16U>.m_Value[4] = '\0';
    (p->m_KeyBuf).super_Identifier<16U>.m_Value[5] = '\0';
    (p->m_KeyBuf).super_Identifier<16U>.m_Value[6] = '\0';
    pSVar3 = &p->m_KeyBuf;
    (pSVar3->super_Identifier<16U>).m_Value[7] = '\0';
    (pSVar3->super_Identifier<16U>).m_Value[8] = '\0';
    (pSVar3->super_Identifier<16U>).m_Value[9] = '\0';
    (pSVar3->super_Identifier<16U>).m_Value[10] = '\0';
    (pSVar3->super_Identifier<16U>).m_Value[0xb] = '\0';
    (pSVar3->super_Identifier<16U>).m_Value[0xc] = '\0';
    (pSVar3->super_Identifier<16U>).m_Value[0xd] = '\0';
    (pSVar3->super_Identifier<16U>).m_Value[0xe] = '\0';
    (p->m_KeyBuf).super_Identifier<16U>.m_Value[0xf] = '\0';
    (p->m_KeyBuf).super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__SymmetricKey_0021a820;
    mem_ptr<ASDCP::AESEncContext::h__AESContext>::set
              ((mem_ptr<ASDCP::AESEncContext::h__AESContext> *)key,p);
    lVar1 = *(long *)key;
    *(undefined1 *)(lVar1 + 0x100) = 1;
    uVar2 = in_RDX[1];
    *(undefined8 *)(lVar1 + 0x101) = *in_RDX;
    *(undefined8 *)(lVar1 + 0x109) = uVar2;
    iVar4 = AES_set_encrypt_key((uchar *)((long)(*(AES_KEY **)key)[1].rd_key + 0xd),0x80,
                                *(AES_KEY **)key);
    if (iVar4 == 0) {
      puVar5 = Kumu::RESULT_OK;
    }
    else {
      print_ssl_error();
      puVar5 = ASDCP::RESULT_CRYPT_INIT;
    }
  }
  else {
    puVar5 = Kumu::RESULT_INIT;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar5);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::AESEncContext::InitKey(const byte_t* key)
{
  KM_TEST_NULL_L(key);

  if ( m_Context )
    return RESULT_INIT;

  m_Context = new h__AESContext;
  m_Context->m_KeyBuf.Set(key);

  if ( AES_set_encrypt_key(m_Context->m_KeyBuf.Value(), KEY_SIZE_BITS, m_Context) )
    {
      print_ssl_error();
      return RESULT_CRYPT_INIT;
    }

  return RESULT_OK;
}